

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::View<int,_false,_std::allocator<unsigned_long>_>::transpose
          (View<int,_false,_std::allocator<unsigned_long>_> *this,size_t c1,size_t c2)

{
  ulong uVar1;
  ulong uVar2;
  size_t *psVar3;
  size_t *psVar4;
  long lVar5;
  bool bVar6;
  runtime_error *this_00;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  
  testInvariant(this);
  if (this->data_ == (pointer)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_0022aa1e:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = (this->geometry_).dimension_;
  if ((uVar2 <= c1) || (uVar2 <= c2)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
    goto LAB_0022aa1e;
  }
  uVar2 = (this->geometry_).dimension_;
  if (uVar2 <= c2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
    goto LAB_0022aa1e;
  }
  if (uVar2 <= c1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
    goto LAB_0022aa1e;
  }
  psVar3 = (this->geometry_).shape_;
  sVar7 = psVar3[c2];
  psVar3[c2] = psVar3[c1];
  if ((this->geometry_).dimension_ <= c1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
    goto LAB_0022aa1e;
  }
  psVar3[c1] = sVar7;
  uVar2 = (this->geometry_).dimension_;
  if (uVar2 <= c2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
    goto LAB_0022aa1e;
  }
  if (uVar2 <= c1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
    goto LAB_0022aa1e;
  }
  psVar4 = (this->geometry_).strides_;
  sVar7 = psVar4[c2];
  psVar4[c2] = psVar4[c1];
  if ((this->geometry_).dimension_ <= c1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
    goto LAB_0022aa1e;
  }
  psVar4[c1] = sVar7;
  sVar7 = (this->geometry_).dimension_;
  if (sVar7 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
    goto LAB_0022aa1e;
  }
  psVar4 = (this->geometry_).shapeStrides_;
  if ((this->geometry_).coordinateOrder_ == FirstMajorOrder) {
    psVar4[sVar7 - 1] = 1;
    if (sVar7 != 1) {
      sVar8 = psVar4[sVar7 - 1];
      do {
        sVar8 = sVar8 * psVar3[sVar7 - 1];
        psVar4[sVar7 - 2] = sVar8;
        sVar7 = sVar7 - 1;
      } while (sVar7 != 1);
    }
  }
  else {
    *psVar4 = 1;
    if (sVar7 != 1) {
      sVar8 = *psVar4;
      lVar9 = 0;
      do {
        sVar8 = sVar8 * psVar3[lVar9];
        psVar4[lVar9 + 1] = sVar8;
        lVar9 = lVar9 + 1;
      } while (sVar7 - 1 != lVar9);
    }
  }
  uVar2 = (this->geometry_).dimension_;
  bVar6 = true;
  if (uVar2 != 0) {
    psVar3 = (this->geometry_).shapeStrides_;
    psVar4 = (this->geometry_).strides_;
    if (*psVar3 == *psVar4) {
      uVar10 = 0;
      do {
        if (uVar2 - 1 == uVar10) goto LAB_0022a8f6;
        lVar9 = uVar10 + 1;
        uVar1 = uVar10 + 1;
        lVar5 = uVar10 + 1;
        uVar10 = uVar1;
      } while (psVar3[lVar9] == psVar4[lVar5]);
      (this->geometry_).isSimple_ = false;
      if (uVar1 < uVar2) goto LAB_0022a8f9;
    }
    else {
      bVar6 = false;
    }
  }
LAB_0022a8f6:
  (this->geometry_).isSimple_ = bVar6;
LAB_0022a8f9:
  testInvariant(this);
  return;
}

Assistant:

void
View<T, isConst, A>::transpose
(
    const std::size_t c1,
    const std::size_t c2
)
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_ARG_TEST ||
        (dimension() != 0 && c1 < dimension() && c2 < dimension()));

    std::size_t j1 = c1;
    std::size_t j2 = c2;
    std::size_t c;
    std::size_t d;

    // transpose shape
    c = geometry_.shape(j2);
    geometry_.shape(j2) = geometry_.shape(j1);
    geometry_.shape(j1) = c;

    // transpose strides
    d = geometry_.strides(j2);
    geometry_.strides(j2) = geometry_.strides(j1);
    geometry_.strides(j1) = d;

    // update shape strides
    marray_detail::stridesFromShape(geometry_.shapeBegin(), geometry_.shapeEnd(),
        geometry_.shapeStridesBegin(), geometry_.coordinateOrder());

    updateSimplicity();
    testInvariant();
}